

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O2

void __thiscall EventLoopThreadPool::start(EventLoopThreadPool *this)

{
  EventLoopThread *this_00;
  int iVar1;
  EventLoopThread *local_50;
  shared_ptr<EventLoopThread> t;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  this->started_ = true;
  for (iVar1 = 0; iVar1 < this->numThreads_; iVar1 = iVar1 + 1) {
    this_00 = (EventLoopThread *)operator_new(0x138);
    EventLoopThread::EventLoopThread(this_00);
    std::__shared_ptr<EventLoopThread,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<EventLoopThread,void>
              ((__shared_ptr<EventLoopThread,(__gnu_cxx::_Lock_policy)2> *)&local_50,this_00);
    std::
    vector<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>::
    push_back(&this->threads_,(value_type *)&local_50);
    t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)EventLoopThread::startLoop(local_50);
    std::vector<EventLoop*,std::allocator<EventLoop*>>::emplace_back<EventLoop*>
              ((vector<EventLoop*,std::allocator<EventLoop*>> *)&this->loops_,
               (EventLoop **)
               &t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t);
  }
  return;
}

Assistant:

void EventLoopThreadPool::start() {
  baseLoop_->assertInLoopThread();
  started_ = true;
  for (int i = 0; i < numThreads_; ++i) {
    std::shared_ptr<EventLoopThread> t(new EventLoopThread());
    threads_.push_back(t);
    loops_.push_back(t->startLoop());
  }
}